

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int i4vec_unique_count(int n,int *a)

{
  int iVar1;
  int local_24;
  int local_20;
  int unique_num;
  int j;
  int i;
  int *a_local;
  int n_local;
  
  local_24 = 0;
  for (unique_num = 0; unique_num < n; unique_num = unique_num + 1) {
    for (local_20 = 0;
        (iVar1 = local_24 + 1, local_20 < unique_num &&
        (iVar1 = local_24, a[unique_num] != a[local_20])); local_20 = local_20 + 1) {
    }
    local_24 = iVar1;
  }
  return local_24;
}

Assistant:

int i4vec_unique_count ( int n, int a[] )

//****************************************************************************80
//
//  Purpose:
//
//    I4VEC_UNIQUE_COUNT counts the unique elements in an unsorted I4VEC.
//
//  Discussion:
//
//    An I4VEC is a vector of I4's.
//
//    Because the array is unsorted, this algorithm is O(N^2).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 April 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of elements of A.
//
//    Input, int A[N], the array to examine, which does NOT have to
//    be sorted.
//
//    Output, int I4VEC_UNIQUE_COUNT, the number of unique elements of A.
//
{
  int i;
  int j;
  int unique_num;

  unique_num = 0;

  for ( i = 0; i < n; i++ )
  {
    unique_num = unique_num + 1;

    for ( j = 0; j < i; j++ )
    {
      if ( a[i] == a[j] )
      {
        unique_num = unique_num - 1;
        break;
      }
    }
  }

  return unique_num;
}